

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

call_modifier<trompeloeil::call_matcher<bool_(int),_std::tuple<int>_>,_GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30,_trompeloeil::sequence_injector<trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(int)>_>_>_>
 __thiscall
trompeloeil::
call_modifier<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>
::in_sequence<std::pair<char_const*,trompeloeil::sequence&>,false>
          (call_modifier<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>
           *this,pair<const_char_*,_trompeloeil::sequence_&> *t)

{
  pair<const_char_*,_trompeloeil::sequence_&> *t_local;
  call_modifier<trompeloeil::call_matcher<bool_(int),_std::tuple<int>_>,_GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30,_trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(int)>_>_>
  *this_local;
  
  call_matcher<bool(int),std::tuple<int>>::
  set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
            (*(call_matcher<bool(int),std::tuple<int>> **)this,t);
  call_modifier<trompeloeil::call_matcher<bool_(int),_std::tuple<int>_>,_GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30,_trompeloeil::sequence_injector<trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(int)>_>_>_>
  ::call_modifier((call_modifier<trompeloeil::call_matcher<bool_(int),_std::tuple<int>_>,_GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30,_trompeloeil::sequence_injector<trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(int)>_>_>_>
                   *)&this_local,*(call_matcher<bool_(int),_std::tuple<int>_> **)this);
  return (call_modifier<trompeloeil::call_matcher<bool_(int),_std::tuple<int>_>,_GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30,_trompeloeil::sequence_injector<trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(int)>_>_>_>
          )(call_matcher<bool_(int),_std::tuple<int>_> *)this_local;
}

Assistant:

call_modifier<Matcher, modifier_tag, sequence_injector<Parent>>
    in_sequence(
      T&& ... t)
    {
      static_assert(!b,
                    "Multiple IN_SEQUENCE does not make sense."
                    " You can list several sequence objects at once");

      static_assert(upper_call_limit > 0,
                    "IN_SEQUENCE for forbidden call does not make sense");

      matcher->set_sequence(std::forward<T>(t)...);
      return {matcher};
    }